

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  bool bVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  size_t *psVar16;
  long lVar17;
  int iVar18;
  size_t sVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar44;
  undefined1 auVar42 [16];
  float fVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  float fVar49;
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  size_t local_1c8;
  size_t local_1c0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  anon_class_16_2_07cfa4d6 local_130;
  ulong local_120;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  
  local_198._8_4_ = 0x7f800000;
  local_198._0_8_ = 0x7f8000007f800000;
  local_198._12_4_ = 0x7f800000;
  auVar47 = ZEXT1664(local_198);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = local_198;
  local_188._8_4_ = 0xff800000;
  local_188._0_8_ = 0xff800000ff800000;
  local_188._12_4_ = 0xff800000;
  auVar48 = ZEXT1664(local_188);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = local_188;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = local_198;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = local_188;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  auVar29._8_8_ = 0;
  auVar29._0_4_ =
       (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.super_Geometry
       .time_range.lower;
  auVar29._4_4_ =
       (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.super_Geometry
       .time_range.upper;
  auVar23._8_8_ = 0;
  auVar23._0_4_ = time_range->lower;
  auVar23._4_4_ = time_range->upper;
  uVar14 = vcmpps_avx512vl(auVar29,auVar23,1);
  auVar46 = vinsertps_avx(auVar23,auVar29,0x50);
  auVar29 = vinsertps_avx(auVar29,auVar23,0x50);
  bVar6 = (bool)((byte)uVar14 & 1);
  auVar22._0_4_ = (float)((uint)bVar6 * auVar46._0_4_ | (uint)!bVar6 * auVar29._0_4_);
  bVar6 = (bool)((byte)(uVar14 >> 1) & 1);
  auVar22._4_4_ = (uint)bVar6 * auVar46._4_4_ | (uint)!bVar6 * auVar29._4_4_;
  bVar6 = (bool)((byte)(uVar14 >> 2) & 1);
  auVar22._8_4_ = (uint)bVar6 * auVar46._8_4_ | (uint)!bVar6 * auVar29._8_4_;
  bVar6 = (bool)((byte)(uVar14 >> 3) & 1);
  auVar22._12_4_ = (uint)bVar6 * auVar46._12_4_ | (uint)!bVar6 * auVar29._12_4_;
  auVar46 = vmovshdup_avx(auVar22);
  fVar49 = auVar46._0_4_;
  if (auVar22._0_4_ <= fVar49) {
    uVar14 = r->_begin;
    local_1c0 = 0;
    auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
    auVar51 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar52 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar53 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_1c8 = k;
    while( true ) {
      auVar29 = auVar48._0_16_;
      auVar46 = auVar47._0_16_;
      if (r->_end <= uVar14) break;
      BVar2 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      auVar24._8_8_ = 0;
      auVar24._0_4_ = BVar2.lower;
      auVar24._4_4_ = BVar2.upper;
      auVar23 = vmovshdup_avx(auVar24);
      fVar27 = BVar2.lower;
      fVar43 = auVar23._0_4_ - fVar27;
      uVar3 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar14);
      pBVar4 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      if ((ulong)(uVar3 + 3) < (pBVar4->super_RawBufferView).num) {
        fVar1 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                super_Geometry.fnumTimeSegments;
        auVar24 = ZEXT416((uint)(fVar1 * ((fVar49 - fVar27) / fVar43) * 0.99999976));
        auVar24 = vroundss_avx(auVar24,auVar24,10);
        auVar56 = vminss_avx(auVar24,ZEXT416((uint)fVar1));
        auVar24 = ZEXT416((uint)(fVar1 * ((auVar22._0_4_ - fVar27) / fVar43) * 1.0000002));
        auVar24 = vroundss_avx(auVar24,auVar24,9);
        auVar24 = vmaxss_avx(auVar50._0_16_,auVar24);
        psVar16 = &pBVar4[(int)auVar24._0_4_].super_RawBufferView.stride;
        uVar15 = (long)(int)auVar24._0_4_ - 1;
LAB_01c090bb:
        uVar15 = uVar15 + 1;
        if ((ulong)(long)(int)auVar56._0_4_ < uVar15) {
          local_130.primID = &local_120;
          fVar28 = auVar23._0_4_ - fVar27;
          fVar45 = (auVar22._0_4_ - fVar27) / fVar28;
          fVar28 = (fVar49 - fVar27) / fVar28;
          fVar43 = fVar1 * fVar45;
          fVar27 = fVar1 * fVar28;
          auVar56 = vroundss_avx(ZEXT416((uint)fVar43),ZEXT416((uint)fVar43),9);
          auVar42 = vroundss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27),10);
          auVar23 = vmaxss_avx(auVar56,auVar50._0_16_);
          auVar24 = vminss_avx(auVar42,ZEXT416((uint)fVar1));
          iVar13 = (int)auVar23._0_4_;
          fVar44 = auVar24._0_4_;
          iVar12 = (int)auVar56._0_4_;
          iVar18 = -1;
          if (-1 < iVar12) {
            iVar18 = iVar12;
          }
          iVar11 = (int)fVar1 + 1;
          if ((int)auVar42._0_4_ < (int)fVar1 + 1) {
            iVar11 = (int)auVar42._0_4_;
          }
          local_130.this = this;
          local_120 = uVar14;
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_130,(long)iVar13);
          linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_130,(long)(int)fVar44);
          fVar43 = fVar43 - auVar23._0_4_;
          if (iVar11 - iVar18 == 1) {
            auVar23 = vmaxss_avx(ZEXT416((uint)fVar43),ZEXT816(0) << 0x40);
            auVar30._0_4_ = auVar23._0_4_;
            fVar43 = 1.0 - auVar30._0_4_;
            auVar30._4_4_ = auVar30._0_4_;
            auVar30._8_4_ = auVar30._0_4_;
            auVar30._12_4_ = auVar30._0_4_;
            auVar54._0_4_ = auVar30._0_4_ * bupper1.lower.field_0._0_4_;
            auVar54._4_4_ = auVar30._0_4_ * bupper1.lower.field_0._4_4_;
            auVar54._8_4_ = auVar30._0_4_ * bupper1.lower.field_0._8_4_;
            auVar54._12_4_ = auVar30._0_4_ * bupper1.lower.field_0._12_4_;
            auVar34._4_4_ = fVar43;
            auVar34._0_4_ = fVar43;
            auVar34._8_4_ = fVar43;
            auVar34._12_4_ = fVar43;
            auVar56 = vfmadd231ps_fma(auVar54,auVar34,(undefined1  [16])blower0.lower.field_0);
            auVar23 = vmulps_avx512vl(auVar30,(undefined1  [16])bupper1.upper.field_0);
            auVar24 = vfmadd231ps_avx512vl(auVar23,(undefined1  [16])blower0.upper.field_0,auVar34);
            auVar23 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar27)),ZEXT816(0) << 0x40);
            auVar31._0_4_ = auVar23._0_4_;
            fVar43 = 1.0 - auVar31._0_4_;
            auVar31._4_4_ = auVar31._0_4_;
            auVar31._8_4_ = auVar31._0_4_;
            auVar31._12_4_ = auVar31._0_4_;
            auVar23 = vmulps_avx512vl(auVar31,(undefined1  [16])blower0.lower.field_0);
            auVar35._4_4_ = fVar43;
            auVar35._0_4_ = fVar43;
            auVar35._8_4_ = fVar43;
            auVar35._12_4_ = fVar43;
            auVar23 = vfmadd231ps_avx512vl(auVar23,auVar35,(undefined1  [16])bupper1.lower.field_0);
            auVar39._0_4_ = auVar31._0_4_ * blower0.upper.field_0._0_4_;
            auVar39._4_4_ = auVar31._0_4_ * blower0.upper.field_0._4_4_;
            auVar39._8_4_ = auVar31._0_4_ * blower0.upper.field_0._8_4_;
            auVar39._12_4_ = auVar31._0_4_ * blower0.upper.field_0._12_4_;
            auVar42 = vfmadd231ps_fma(auVar39,auVar35,(undefined1  [16])bupper1.upper.field_0);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&blower1,&local_130,(long)(iVar13 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      (&bupper0,&local_130,(long)((int)fVar44 + -1));
            auVar23 = vmaxss_avx(ZEXT416((uint)fVar43),ZEXT816(0) << 0x40);
            auVar25._0_4_ = auVar23._0_4_;
            fVar43 = 1.0 - auVar25._0_4_;
            auVar25._4_4_ = auVar25._0_4_;
            auVar25._8_4_ = auVar25._0_4_;
            auVar25._12_4_ = auVar25._0_4_;
            auVar55._0_4_ = auVar25._0_4_ * blower1.lower.field_0.m128[0];
            auVar55._4_4_ = auVar25._0_4_ * blower1.lower.field_0.m128[1];
            auVar55._8_4_ = auVar25._0_4_ * blower1.lower.field_0.m128[2];
            auVar55._12_4_ = auVar25._0_4_ * blower1.lower.field_0.m128[3];
            auVar36._4_4_ = fVar43;
            auVar36._0_4_ = fVar43;
            auVar36._8_4_ = fVar43;
            auVar36._12_4_ = fVar43;
            auVar56 = vfmadd231ps_fma(auVar55,auVar36,(undefined1  [16])blower0.lower.field_0);
            auVar23 = vmulps_avx512vl(auVar25,(undefined1  [16])blower1.upper.field_0);
            auVar24 = vfmadd231ps_avx512vl(auVar23,auVar36,(undefined1  [16])blower0.upper.field_0);
            auVar23 = vmaxss_avx(ZEXT416((uint)(fVar44 - fVar27)),ZEXT816(0) << 0x40);
            auVar26._0_4_ = auVar23._0_4_;
            fVar43 = 1.0 - auVar26._0_4_;
            auVar26._4_4_ = auVar26._0_4_;
            auVar26._8_4_ = auVar26._0_4_;
            auVar26._12_4_ = auVar26._0_4_;
            auVar23 = vmulps_avx512vl(auVar26,(undefined1  [16])bupper0.lower.field_0);
            auVar37._4_4_ = fVar43;
            auVar37._0_4_ = fVar43;
            auVar37._8_4_ = fVar43;
            auVar37._12_4_ = fVar43;
            auVar23 = vfmadd231ps_avx512vl(auVar23,auVar37,(undefined1  [16])bupper1.lower.field_0);
            auVar41._0_4_ = auVar26._0_4_ * bupper0.upper.field_0.m128[0];
            auVar41._4_4_ = auVar26._0_4_ * bupper0.upper.field_0.m128[1];
            auVar41._8_4_ = auVar26._0_4_ * bupper0.upper.field_0.m128[2];
            auVar41._12_4_ = auVar26._0_4_ * bupper0.upper.field_0.m128[3];
            auVar42 = vfmadd231ps_fma(auVar41,auVar37,(undefined1  [16])bupper1.upper.field_0);
            if (iVar12 < 0) {
              iVar12 = -1;
            }
            sVar19 = (size_t)iVar12;
            while (sVar19 = sVar19 + 1, (long)sVar19 < (long)iVar11) {
              auVar32._0_4_ = ((float)(int)sVar19 / fVar1 - fVar45) / (fVar28 - fVar45);
              fVar43 = 1.0 - auVar32._0_4_;
              auVar32._4_4_ = auVar32._0_4_;
              auVar32._8_4_ = auVar32._0_4_;
              auVar32._12_4_ = auVar32._0_4_;
              auVar25 = vmulps_avx512vl(auVar23,auVar32);
              auVar38._4_4_ = fVar43;
              auVar38._0_4_ = fVar43;
              auVar38._8_4_ = fVar43;
              auVar38._12_4_ = fVar43;
              auVar25 = vfmadd231ps_fma(auVar25,auVar38,auVar56);
              auVar33._0_4_ = auVar42._0_4_ * auVar32._0_4_;
              fVar43 = auVar42._4_4_;
              auVar33._4_4_ = fVar43 * auVar32._0_4_;
              fVar27 = auVar42._8_4_;
              auVar33._8_4_ = fVar27 * auVar32._0_4_;
              fVar44 = auVar42._12_4_;
              auVar33._12_4_ = fVar44 * auVar32._0_4_;
              auVar26 = vfmadd231ps_avx512vl(auVar33,auVar24,auVar38);
              linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_130,sVar19);
              local_1a8 = auVar56._0_4_;
              fStack_1a4 = auVar56._4_4_;
              fStack_1a0 = auVar56._8_4_;
              fStack_19c = auVar56._12_4_;
              auVar56 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar25);
              auVar25 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar26);
              auVar26 = vminps_avx(auVar56,ZEXT816(0) << 0x40);
              auVar25 = vmaxps_avx(auVar25,ZEXT816(0) << 0x40);
              auVar56._0_4_ = local_1a8 + auVar26._0_4_;
              auVar56._4_4_ = fStack_1a4 + auVar26._4_4_;
              auVar56._8_4_ = fStack_1a0 + auVar26._8_4_;
              auVar56._12_4_ = fStack_19c + auVar26._12_4_;
              auVar23 = vaddps_avx512vl(auVar23,auVar26);
              auVar24 = vaddps_avx512vl(auVar24,auVar25);
              auVar42._0_4_ = auVar42._0_4_ + auVar25._0_4_;
              auVar42._4_4_ = fVar43 + auVar25._4_4_;
              auVar42._8_4_ = fVar27 + auVar25._8_4_;
              auVar42._12_4_ = fVar44 + auVar25._12_4_;
            }
          }
          auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar9 = vcmpps_avx512vl(auVar56,auVar24,2);
          auVar47 = ZEXT1664(auVar46);
          auVar48 = ZEXT1664(auVar29);
          auVar51 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          auVar52 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar53 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if (((~(ushort)uVar9 & 7) == 0) &&
             (uVar9 = vcmpps_avx512vl(auVar23,auVar42,2), (~(ushort)uVar9 & 7) == 0)) {
            auVar23 = vminps_avx512vl(auVar56,auVar23);
            aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar23,ZEXT416(geomID),0x30);
            auVar23 = vmaxps_avx512vl(auVar24,auVar42);
            aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar23,ZEXT416((uint)uVar14),0x30);
            auVar40._0_4_ = aVar7.x + aVar8.x;
            auVar40._4_4_ = aVar7.y + aVar8.y;
            auVar40._8_4_ = aVar7.z + aVar8.z;
            auVar40._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
            local_198 = vminps_avx(local_198,(undefined1  [16])aVar7);
            local_188 = vmaxps_avx(local_188,(undefined1  [16])aVar8);
            auVar46 = vminps_avx(auVar46,auVar40);
            auVar47 = ZEXT1664(auVar46);
            auVar46 = vmaxps_avx(auVar29,auVar40);
            auVar48 = ZEXT1664(auVar46);
            local_1c0 = local_1c0 + 1;
            prims[local_1c8].lower.field_0.field_1 = aVar7;
            prims[local_1c8].upper.field_0.field_1 = aVar8;
            local_1c8 = local_1c8 + 1;
          }
        }
        else {
          pcVar5 = ((RawBufferView *)(psVar16 + -2))->ptr_ofs;
          sVar19 = *psVar16;
          auVar42 = auVar51._0_16_;
          auVar24 = vandps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + sVar19 * uVar3 + 0xc)));
          if (auVar24._0_4_ < 1.844e+18) {
            lVar20 = sVar19 * (uVar3 + 1);
            auVar24 = vandps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar20 + 0xc)));
            if (auVar24._0_4_ < 1.844e+18) {
              lVar21 = sVar19 * (uVar3 + 2);
              auVar24 = vandps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar21 + 0xc)));
              if (auVar24._0_4_ < 1.844e+18) {
                lVar17 = sVar19 * (uVar3 + 3);
                auVar24 = vandps_avx(auVar42,ZEXT416(*(uint *)(pcVar5 + lVar17 + 0xc)));
                if (auVar24._0_4_ < 1.844e+18) {
                  auVar24 = auVar52._0_16_;
                  uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + sVar19 * uVar3),auVar24,6)
                  ;
                  auVar42 = auVar53._0_16_;
                  uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + sVar19 * uVar3),auVar42,1
                                          );
                  if ((~((ushort)uVar9 & (ushort)uVar10) & 7) == 0) {
                    uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar20),auVar24,6);
                    uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar20),auVar42,1);
                    if ((~((ushort)uVar9 & (ushort)uVar10) & 7) == 0) {
                      uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar21),auVar24,6);
                      uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar21),auVar42,1);
                      if ((~((ushort)uVar9 & (ushort)uVar10) & 7) == 0) goto code_r0x01c091a1;
                    }
                  }
                }
              }
            }
          }
        }
      }
LAB_01c091d0:
      uVar14 = uVar14 + 1;
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_198._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_188._8_8_;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
     field_0.m128 = auVar46;
    *(undefined1 (*) [16])
     (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
     field_0.m128 = auVar29;
    __return_storage_ptr__->end = local_1c0;
  }
  return __return_storage_ptr__;
code_r0x01c091a1:
  psVar16 = psVar16 + 7;
  uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar17),auVar24,6);
  uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar5 + lVar17),auVar42,1);
  if ((~((ushort)uVar9 & (ushort)uVar10) & 7) != 0) goto LAB_01c091d0;
  goto LAB_01c090bb;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }